

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O2

shared_ptr<QPDFOutlineObjectHelper> __thiscall
QPDFOutlineObjectHelper::getParent(QPDFOutlineObjectHelper *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<QPDFOutlineObjectHelper> sVar1;
  
  std::__shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)(in_RSI + 0x28) + 8));
  sVar1.super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<QPDFOutlineObjectHelper>)
         sVar1.super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFOutlineObjectHelper>
QPDFOutlineObjectHelper::getParent()
{
    return m->parent;
}